

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O2

QColormap * __thiscall QColormap::operator=(QColormap *this,QColormap *colormap)

{
  qAtomicAssign<QColormapPrivate>(&this->d,colormap->d);
  return this;
}

Assistant:

QColormap &QColormap::operator=(const QColormap &colormap)
{ qAtomicAssign(d, colormap.d); return *this; }